

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

_Bool av1_resize_plane_to_half
                (uint8_t *input,int height,int width,int in_stride,uint8_t *output,int height2,
                int width2,int out_stride)

{
  byte bVar1;
  uint8_t *puVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  uint8_t *in_RDI;
  uint8_t *in_R8;
  int in_R9D;
  int in_stack_00000008;
  _Bool mem_status;
  uint8_t *intbuf;
  undefined7 in_stack_ffffffffffffffc0;
  _Bool local_1;
  
  puVar2 = (uint8_t *)aom_malloc(0x6e76ce);
  if (puVar2 == (uint8_t *)0x0) {
    local_1 = false;
  }
  else {
    (*av1_resize_horz_dir)(in_RDI,in_ECX,puVar2,in_ESI,in_EDX,in_stack_00000008);
    bVar1 = (*av1_resize_vert_dir)(puVar2,in_R8,(int)intbuf,in_ESI,in_R9D,in_stack_00000008,0);
    aom_free((void *)CONCAT17(bVar1,in_stack_ffffffffffffffc0));
    local_1 = (_Bool)(bVar1 & 1);
  }
  return local_1;
}

Assistant:

bool av1_resize_plane_to_half(const uint8_t *const input, int height, int width,
                              int in_stride, uint8_t *output, int height2,
                              int width2, int out_stride) {
  uint8_t *intbuf = (uint8_t *)aom_malloc(sizeof(*intbuf) * width2 * height);
  if (intbuf == NULL) {
    return false;
  }

  // Resize in the horizontal direction
  av1_resize_horz_dir(input, in_stride, intbuf, height, width, width2);
  // Resize in the vertical direction
  bool mem_status = av1_resize_vert_dir(intbuf, output, out_stride, height,
                                        height2, width2, 0 /*start_col*/);
  aom_free(intbuf);
  return mem_status;
}